

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsObjectiveFunction.cpp
# Opt level: O3

void __thiscall
HighsObjectiveFunction::setupCliquePartition
          (HighsObjectiveFunction *this,HighsDomain *globaldom,HighsCliqueTable *cliqueTable)

{
  vector<int,_std::allocator<int>_> *partitionStart;
  ulong uVar1;
  double *pdVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  pointer piVar3;
  int *piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  int log;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  HighsInt col;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqvars;
  bool local_5d;
  int local_5c;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_58;
  HighsCliqueTable *local_38;
  
  iVar12 = this->numBinary;
  if (1 < (long)iVar12) {
    local_58.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    piVar3 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    local_38 = cliqueTable;
    do {
      local_5c = *(int *)((long)piVar3 + lVar9);
      pdVar2 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + local_5c;
      local_5d = *pdVar2 <= 0.0 && *pdVar2 != 0.0;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      emplace_back<int&,bool>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &local_58,&local_5c,&local_5d);
      lVar9 = lVar9 + 4;
    } while ((long)iVar12 * 4 != lVar9);
    partitionStart = &this->cliquePartitionStart;
    HighsCliqueTable::cliquePartition(local_38,&this->model->col_cost_,&local_58,partitionStart);
    piVar4 = (this->cliquePartitionStart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (int)((ulong)((long)(this->cliquePartitionStart).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar4) >> 2) - 1;
    if (uVar11 == this->numBinary) {
      std::vector<int,_std::allocator<int>_>::resize(partitionStart,1);
    }
    else {
      if ((int)uVar11 < 1) {
        iVar12 = 0;
        iVar13 = 0;
      }
      else {
        piVar3 = (this->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = *piVar4;
        iVar13 = 0;
        iVar12 = 0;
        uVar7 = 0;
        do {
          uVar1 = uVar7 + 1;
          iVar10 = piVar4[uVar7 + 1] - iVar8;
          iVar8 = piVar4[uVar7 + 1];
          if (iVar10 != 1) {
            piVar4[iVar13] = iVar12;
            lVar9 = (long)piVar4[uVar7];
            iVar8 = piVar4[uVar1];
            if (piVar4[uVar7] < iVar8) {
              do {
                piVar3[(uint)local_58.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar9] & 0x7fffffff] = iVar12
                ;
                iVar12 = iVar12 + 1;
                lVar9 = lVar9 + 1;
                iVar8 = piVar4[uVar1];
              } while (lVar9 < iVar8);
            }
            iVar13 = iVar13 + 1;
          }
          uVar7 = uVar1;
        } while (uVar1 != uVar11);
      }
      piVar4[iVar13] = iVar12;
      std::vector<int,_std::allocator<int>_>::resize(partitionStart,(long)(iVar13 + 1));
      uVar7 = (ulong)this->numBinary;
      if (uVar7 != 0) {
        begin._M_current =
             (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        iVar12 = 0;
        end._M_current = begin._M_current + uVar7;
        if (this->numBinary != 1) {
          iVar12 = 0;
          do {
            uVar7 = (long)uVar7 >> 1;
            iVar12 = iVar12 + 1;
          } while (1 < uVar7);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsObjectiveFunction::setupCliquePartition(HighsDomain_const&,HighsCliqueTable&)::__0,false>
                  (begin,end,(anon_class_8_1_8991fb9c)this,iVar12,true);
        iVar12 = this->numBinary;
        if (0 < (long)iVar12) {
          piVar3 = (this->objectiveNonzeros).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (this->objectiveVals).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar9 = 0;
          do {
            pdVar6[lVar9] = pdVar5[piVar3[lVar9]];
            lVar9 = lVar9 + 1;
          } while (iVar12 != lVar9);
        }
      }
    }
    if (local_58.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsObjectiveFunction::setupCliquePartition(
    const HighsDomain& globaldom, HighsCliqueTable& cliqueTable) {
  // skip if not more than 1 binary column is present
  if (numBinary <= 1) return;

  std::vector<HighsCliqueTable::CliqueVar> clqvars;

  auto binaryEnd = objectiveNonzeros.begin() + numBinary;

  for (auto it = objectiveNonzeros.begin(); it != binaryEnd; ++it) {
    HighsInt col = *it;
    clqvars.emplace_back(col, model->col_cost_[col] < 0.0);
  }

  cliqueTable.cliquePartition(model->col_cost_, clqvars, cliquePartitionStart);
  HighsInt numPartitions = cliquePartitionStart.size() - 1;
  if (numPartitions == numBinary)
    cliquePartitionStart.resize(1);
  else {
    HighsInt p = 0;
    HighsInt k = 0;

    for (HighsInt i = 0; i < numPartitions; ++i) {
      if (cliquePartitionStart[i + 1] - cliquePartitionStart[i] == 1) continue;

      cliquePartitionStart[p] = k;

      for (HighsInt j = cliquePartitionStart[i];
           j < cliquePartitionStart[i + 1]; ++j) {
        colToPartition[clqvars[j].col] = k++;
      }

      ++p;
    }

    cliquePartitionStart[p] = k;
    cliquePartitionStart.resize(p + 1);

    pdqsort(objectiveNonzeros.begin(), objectiveNonzeros.begin() + numBinary,
            [&](HighsInt i, HighsInt j) {
              return std::make_pair((HighsUInt)colToPartition[i],
                                    HighsHashHelpers::hash(i)) <
                     std::make_pair((HighsUInt)colToPartition[j],
                                    HighsHashHelpers::hash(j));
            });

    for (HighsInt i = 0; i < numBinary; ++i)
      objectiveVals[i] = model->col_cost_[objectiveNonzeros[i]];
  }
}